

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

void __thiscall
cmLinkLineComputer::ComputeLinkLibs
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  TargetType TVar2;
  ItemVector *this_01;
  string local_128;
  string local_108;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e8;
  cmListFileBacktrace local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> linkLib;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  ItemVector *items;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkLibraries_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  
  this_01 = cmComputeLinkInformation::GetItems(cli);
  __end1 = std::
           vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
           begin(this_01);
  item = (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                     *)&item), bVar1) {
    linkLib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
         ::operator*(&__end1);
    if ((((reference)
         linkLib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->Target == (cmGeneratorTarget *)0x0) ||
       (TVar2 = cmGeneratorTarget::GetType
                          (((reference)
                           linkLib.Backtrace.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->Target), TVar2 != INTERFACE_LIBRARY)) {
      std::__cxx11::string::string((string *)&local_98);
      local_a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_a8);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78,&local_98,&local_a8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_a8);
      std::__cxx11::string::~string((string *)&local_98);
      this_00 = linkLib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      if (*(int *)&linkLib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi[3]._vptr__Sp_counted_base == 1) {
        (*this->_vptr_cmLinkLineComputer[2])(&local_128);
        ConvertToOutputFormat(&local_108,this,&local_128);
        cmComputeLinkInformation::Item::GetFormattedItem(&local_e8,(Item *)this_00._M_pi,&local_108)
        ;
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78,&local_e8);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
      }
      else {
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78,
                  (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)linkLib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
      }
      std::__cxx11::string::operator+=((string *)local_78," ");
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 linkLibraries,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78);
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkLibs(
  cmComputeLinkInformation& cli, std::vector<BT<std::string>>& linkLibraries)
{
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      linkLib = item.GetFormattedItem(this->ConvertToOutputFormat(
        this->ConvertToLinkReference(item.Value.Value)));
    } else {
      linkLib = item.Value;
    }
    linkLib.Value += " ";

    linkLibraries.emplace_back(linkLib);
  }
}